

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::OccludedStaticFragDepthCostCase::logDescription
          (OccludedStaticFragDepthCostCase *this)

{
  ostringstream *poVar1;
  TestLog *this_00;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [384];
  
  this_00 = ((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.m_testCtx)->
            m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Description",&local_1d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Test description",&local_1d2);
  tcu::LogSection::LogSection((LogSection *)local_190,&local_1b0,&local_1d0);
  tcu::LogSection::write((LogSection *)local_190,(int)this_00,__buf,in_RCX);
  tcu::LogSection::~LogSection((LogSection *)local_190);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Testing hidden fragment culling speed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Geometry consists of two fullsceen quads. The first (occluding) is rendered once, the second (occluded) is rendered repeatedly"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Workload indicates the number of times the occluded quad is rendered");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"The occluded quad has a static offset applied to gl_FragDepth")
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "The time per culled pixel is estimated from the rate of change of rendering time as a function of workload"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestLog::endSection(this_00);
  return;
}

Assistant:

virtual void		logDescription						(void)
	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Section("Description", "Test description");
		log << TestLog::Message << "Testing hidden fragment culling speed" << TestLog::EndMessage;
		log << TestLog::Message << "Geometry consists of two fullsceen quads. The first (occluding) is rendered once, the second (occluded) is rendered repeatedly" << TestLog::EndMessage;
		log << TestLog::Message << "Workload indicates the number of times the occluded quad is rendered" << TestLog::EndMessage;
		log << TestLog::Message << "The occluded quad has a static offset applied to gl_FragDepth" << TestLog::EndMessage;
		log << TestLog::Message << "The time per culled pixel is estimated from the rate of change of rendering time as a function of workload"  << TestLog::EndMessage;
		log << TestLog::EndSection;
	}